

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

recursive_directory_iterator __thiscall
ghc::filesystem::begin(filesystem *this,recursive_directory_iterator *iter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  recursive_directory_iterator rVar1;
  recursive_directory_iterator *iter_local;
  
  recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)this,iter);
  rVar1._impl.
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  rVar1._impl.
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (recursive_directory_iterator)
         rVar1._impl.
         super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

GHC_INLINE recursive_directory_iterator begin(recursive_directory_iterator iter) noexcept
{
    return iter;
}